

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void do_cmd_pref_file_hack(long row)

{
  wchar_t row_00;
  _Bool _Var1;
  char *prompt;
  _Bool local_69;
  char local_68 [7];
  _Bool ok;
  char ftmp [80];
  long row_local;
  
  screen_save();
  row_00 = (wchar_t)row;
  if (0 < row) {
    prt("",row_00 + L'\xffffffff',L'\0');
  }
  prt("Command: Load a user pref file",row_00,L'\0');
  prt("",row_00 + L'\x01',L'\0');
  prt("File: ",row_00 + L'\x02',L'\0');
  prt("",row_00 + L'\x03',L'\0');
  player_safe_name(local_68,0x50,player->full_name,true);
  my_strcat(local_68,".prf",0x50);
  if ((arg_force_name & 1U) == 0) {
    local_69 = askfor_aux(local_68,0x50,
                          (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
  }
  else {
    prompt = format("Confirm loading %s? ");
    local_69 = get_check(prompt);
  }
  if (local_69 != false) {
    _Var1 = process_pref_file(local_68,false,true);
    if (_Var1) {
      prt("",L'\0',L'\0');
      msg("Loaded \'%s\'.",local_68);
    }
    else {
      prt("",L'\0',L'\0');
      msg("Failed to load \'%s\'!",local_68);
    }
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_pref_file_hack(long row)
{
	char ftmp[80];
	bool ok;

	screen_save();

	/* Prompt */
	if (row > 0) {
		prt("", row - 1, 0);
	}
	prt("Command: Load a user pref file", row, 0);
	prt("", row + 1, 0);
	prt("File: ", row + 2, 0);
	prt("", row + 3, 0);

	/* Get the filesystem-safe name and append .prf */
	player_safe_name(ftmp, sizeof(ftmp), player->full_name, true);
	my_strcat(ftmp, ".prf", sizeof(ftmp));

	if(!arg_force_name)
		ok = askfor_aux(ftmp, sizeof ftmp, NULL);
	else
		ok = get_check(format("Confirm loading %s? ", ftmp));
	
	/* Ask for a file (or cancel) */
	if(ok) {
		/* Process the given filename */
		if (process_pref_file(ftmp, false, true) == false) {
			/* Mention failure */
			prt("", 0, 0);
			msg("Failed to load '%s'!", ftmp);
		} else {
			/* Mention success */
			prt("", 0, 0);
			msg("Loaded '%s'.", ftmp);
		}
	}

	screen_load();
}